

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat4 * dja::mat4::homogeneous::orthographic
                 (mat4 *__return_storage_ptr__,float_t left,float_t right,float_t bottom,float_t top
                 ,float_t zNear,float_t zFar)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float_t tz;
  float_t ty;
  float_t tx;
  float_t d3;
  float_t d2;
  float_t d1;
  float_t c3;
  float_t c2;
  float_t c1;
  float_t zFar_local;
  float_t zNear_local;
  float_t top_local;
  float_t bottom_local;
  float_t right_local;
  float_t left_local;
  
  bVar1 = false;
  if ((left != right) || (NAN(left) || NAN(right))) {
    bVar1 = false;
    if ((bottom != top) || (NAN(bottom) || NAN(top))) {
      bVar1 = zNear != zFar;
    }
  }
  if (bVar1) {
    fVar2 = 1.0 / (right - left);
    fVar3 = 1.0 / (top - bottom);
    fVar4 = 1.0 / (zFar - zNear);
    mat4(__return_storage_ptr__,0.0,fVar2 * 2.0,0.0,-(right + left) * fVar2,0.0,0.0,fVar3 * 2.0,
         -(top + bottom) * fVar3,fVar4 * -2.0,0.0,0.0,-(zFar + zNear) * fVar4,0.0,0.0,0.0,1.0);
    return __return_storage_ptr__;
  }
  __assert_fail("left != right && bottom != top && zNear != zFar",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_algebra/dj_algebra.h"
                ,0x35c,
                "static mat4 dja::mat4::homogeneous::orthographic(float_t, float_t, float_t, float_t, float_t, float_t)"
               );
}

Assistant:

mat4
mat4::homogeneous::orthographic(
    float_t left, float_t right,
    float_t bottom, float_t top,
    float_t zNear, float_t zFar
) {
    DJA_ASSERT(left != right && bottom != top && zNear != zFar);
    float_t c1 = float_t(1) / (right - left);
    float_t c2 = float_t(1) / (top - bottom);
    float_t c3 = float_t(1) / (zFar - zNear);
    float_t d1 = float_t(2) * c1;
    float_t d2 = float_t(2) * c2;
    float_t d3 = -float_t(2) * c3;
    float_t tx = -(right + left) * c1;
    float_t ty = -(top + bottom) * c2;
    float_t tz = -(zFar + zNear) * c3;

#if 0 // Standard OpenGL
    return mat4(d1, 0 , 0 , tx,
                0 , d2, 0 , ty,
                0 , 0 , d3, tz,
                0 , 0 , 0 ,  1);
#else // XYZ -> OpenGL
    return mat4(0 , d1, 0 , tx,
                0 , 0 , d2, ty,
                d3, 0 , 0 , tz,
                0 , 0 , 0 ,  1);
#endif
}